

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,double v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  if (ABS(v) <= 9007199254740992.0) {
    lVar3 = 0x7fffffffffffffff;
    lVar2 = (long)v;
    if ((lVar2 != -0x8000000000000000) || (v == -9.223372036854776e+18)) {
      bVar1 = v == (double)lVar2;
      lVar3 = lVar2;
      goto LAB_002fb4fd;
    }
    if (0.0 < v) {
      bVar1 = false;
      goto LAB_002fb4fd;
    }
  }
  else {
    lVar2 = 0;
  }
  bVar1 = false;
  lVar3 = lVar2;
LAB_002fb4fd:
  if (bVar1) {
    (this->value).n = lVar3;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = Integer;
    return;
  }
  (this->value).n = 0;
  (this->value).container = (QCborContainerPrivate *)0x0;
  (this->value).t = Double;
  (this->value).n = (qint64)v;
  return;
}

Assistant:

QJsonValue::QJsonValue(double v)
    : value(doubleValueHelper(v))
{
}